

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::convertToSceneSpec
          (SamplePosRasterizationTest *this,TriangleSceneSpec *scene,Vec2 *samplePos)

{
  size_type sVar1;
  const_reference pvVar2;
  float fVar3;
  float fVar4;
  tcu local_f8 [8];
  float local_f0 [2];
  tcu local_e8 [8];
  float local_e0 [2];
  tcu local_d8 [8];
  float local_d0 [2];
  undefined1 local_c8 [8];
  SceneTriangle triangle;
  int triangleNdx;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  undefined1 local_30 [8];
  Vec4 offset;
  Vec2 *samplePos_local;
  TriangleSceneSpec *scene_local;
  SamplePosRasterizationTest *this_local;
  
  offset.m_data._8_8_ = samplePos;
  fVar3 = tcu::Vector<float,_2>::x(samplePos);
  fVar4 = tcu::Vector<float,_2>::y((Vector<float,_2> *)offset.m_data._8_8_);
  tcu::Vector<float,_4>::Vector(&local_50,fVar3 - 0.5,fVar4 - 0.5,0.0,0.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)triangle.sharedEdge,(float)this->m_canvasSize,
             (float)this->m_canvasSize,1.0,1.0);
  tcu::operator/((tcu *)&local_40,&local_50,(Vector<float,_4> *)triangle.sharedEdge);
  tcu::operator*((tcu *)local_30,&local_40,2.0);
  triangle.colors[2].m_data[3] = 0.0;
  while( true ) {
    fVar3 = triangle.colors[2].m_data[3];
    sVar1 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
            ::size(&this->m_testTriangles);
    if ((int)sVar1 <= (int)fVar3) break;
    tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_c8);
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
             ::operator[](&this->m_testTriangles,(long)(int)triangle.colors[2].m_data[3]);
    tcu::operator-(local_d8,&pvVar2->p1,(Vector<float,_4> *)local_30);
    local_c8[0] = local_d8[0];
    local_c8[1] = local_d8[1];
    local_c8[2] = local_d8[2];
    local_c8[3] = local_d8[3];
    local_c8[4] = local_d8[4];
    local_c8[5] = local_d8[5];
    local_c8[6] = local_d8[6];
    local_c8[7] = local_d8[7];
    triangle.positions[0].m_data[0] = local_d0[0];
    triangle.positions[0].m_data[1] = local_d0[1];
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
             ::operator[](&this->m_testTriangles,(long)(int)triangle.colors[2].m_data[3]);
    tcu::operator-(local_e8,&pvVar2->p2,(Vector<float,_4> *)local_30);
    triangle.positions[0].m_data._8_8_ = local_e8;
    triangle.positions[1].m_data[0] = local_e0[0];
    triangle.positions[1].m_data[1] = local_e0[1];
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
             ::operator[](&this->m_testTriangles,(long)(int)triangle.colors[2].m_data[3]);
    tcu::operator-(local_f8,&pvVar2->p3,(Vector<float,_4> *)local_30);
    triangle.positions[1].m_data._8_8_ = local_f8;
    triangle.positions[2].m_data[0] = local_f0[0];
    triangle.positions[2].m_data[1] = local_f0[1];
    triangle.colors[2].m_data[2]._0_1_ = 0;
    triangle.colors[2].m_data[2]._1_1_ = 0;
    triangle.colors[2].m_data[2]._2_1_ = 0;
    std::
    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ::push_back(&scene->triangles,(value_type *)local_c8);
    triangle.colors[2].m_data[3] = (float)((int)triangle.colors[2].m_data[3] + 1);
  }
  return;
}

Assistant:

void SamplePosRasterizationTest::convertToSceneSpec (TriangleSceneSpec& scene, const tcu::Vec2& samplePos) const
{
	// Triangles are offset from the pixel center by "offset". Move the triangles back to take this into account.
	const tcu::Vec4 offset = tcu::Vec4(samplePos.x() - 0.5f, samplePos.y() - 0.5f, 0.0f, 0.0f) / tcu::Vec4((float)m_canvasSize, (float)m_canvasSize, 1.0f, 1.0f) * 2.0f;

	for (int triangleNdx = 0; triangleNdx < (int)m_testTriangles.size(); ++triangleNdx)
	{
		TriangleSceneSpec::SceneTriangle triangle;

		triangle.positions[0] = m_testTriangles[triangleNdx].p1 - offset;
		triangle.positions[1] = m_testTriangles[triangleNdx].p2 - offset;
		triangle.positions[2] = m_testTriangles[triangleNdx].p3 - offset;

		triangle.sharedEdge[0] = false;
		triangle.sharedEdge[1] = false;
		triangle.sharedEdge[2] = false;

		scene.triangles.push_back(triangle);
	}
}